

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::HlslParseContext::expandArguments
          (HlslParseContext *this,TSourceLoc *loc,TFunction *function,TIntermTyped **arguments)

{
  TType *type;
  pointer ppTVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TIntermTyped *pTVar7;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long lVar8;
  undefined4 extraout_var_04;
  TTypeList *pTVar9;
  undefined4 extraout_var_05;
  TIntermAggregate *left;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  iterator __position;
  undefined4 extraout_var_08;
  int memb;
  int param;
  int iVar10;
  ulong uVar11;
  TIntermTyped **ppTVar12;
  pointer ppTVar13;
  TVector<glslang::TIntermTyped_*> memberArgs;
  TIntermTyped *local_40;
  TIntermAggregate *aggregate;
  TIntermAggregate *pTVar6;
  undefined4 extraout_var_01;
  
  iVar3 = (*((*arguments)->super_TIntermNode)._vptr_TIntermNode[6])();
  pTVar6 = (TIntermAggregate *)CONCAT44(extraout_var,iVar3);
  iVar3 = 0;
  uVar11 = 0;
  aggregate = pTVar6;
  while( true ) {
    iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
    iVar10 = (int)uVar11;
    if (iVar4 <= iVar10) break;
    iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
    if ((iVar4 == 1) || (pTVar6 == (TIntermAggregate *)0x0)) {
      pTVar7 = *arguments;
    }
    else {
      iVar4 = (*(pTVar6->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x32])();
      pTVar7 = *(TIntermTyped **)
                (*(long *)(CONCAT44(extraout_var_00,iVar4) + 8) + (long)(iVar3 + iVar10) * 8);
    }
    iVar4 = (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[3])();
    pTVar7 = (TIntermTyped *)CONCAT44(extraout_var_01,iVar4);
    bVar2 = wasFlattened(this,pTVar7);
    if (bVar2) {
      iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,uVar11);
      type = *(TType **)(CONCAT44(extraout_var_02,iVar4) + 8);
      iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,uVar11);
      lVar8 = (**(code **)(**(long **)(CONCAT44(extraout_var_03,iVar4) + 8) + 0x50))();
      bVar2 = shouldFlatten(this,type,*(TStorageQualifier *)(lVar8 + 8) & 0x7f,true);
      if (bVar2) {
        TVector<glslang::TIntermTyped_*>::TVector(&memberArgs);
        iVar4 = 0;
        while( true ) {
          iVar5 = (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar7);
          pTVar9 = TType::getStruct((TType *)CONCAT44(extraout_var_04,iVar5));
          if ((int)((ulong)((long)(pTVar9->
                                  super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                  ).
                                  super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pTVar9->
                                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                 ).
                                 super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 5) <= iVar4) break;
          local_40 = flattenAccess(this,pTVar7,iVar4);
          std::vector<glslang::TIntermTyped*,glslang::pool_allocator<glslang::TIntermTyped*>>::
          emplace_back<glslang::TIntermTyped*>
                    ((vector<glslang::TIntermTyped*,glslang::pool_allocator<glslang::TIntermTyped*>>
                      *)&memberArgs,&local_40);
          iVar4 = iVar4 + 1;
        }
        if ((long)memberArgs.
                  super_vector<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
                  .
                  super__Vector_base<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)memberArgs.
                  super_vector<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
                  .
                  super__Vector_base<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
                  ._M_impl.super__Vector_impl_data._M_start == 8) {
          pTVar7 = *memberArgs.
                    super_vector<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
                    .
                    super__Vector_base<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
          ppTVar12 = arguments;
          if ((pTVar6 != (TIntermAggregate *)0x0) && (iVar4 + iVar3 != 1)) {
            iVar4 = (*(pTVar6->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                      _vptr_TIntermNode[0x32])();
            ppTVar12 = (TIntermTyped **)
                       ((long)(iVar3 + iVar10) * 8 + *(long *)(CONCAT44(extraout_var_05,iVar4) + 8))
            ;
          }
          *ppTVar12 = pTVar7;
        }
        else if (8 < (ulong)((long)memberArgs.
                                   super_vector<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
                                   .
                                   super__Vector_base<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)memberArgs.
                                  super_vector<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
                                  .
                                  super__Vector_base<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start)) {
          iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
          if (iVar4 + iVar3 == 1) {
            left = TIntermediate::makeAggregate
                             ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                              &(*memberArgs.
                                 super_vector<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
                                 .
                                 super__Vector_base<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->super_TIntermNode);
            ppTVar1 = memberArgs.
                      super_vector<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
                      .
                      super__Vector_base<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            *arguments = (TIntermTyped *)left;
            ppTVar13 = memberArgs.
                       super_vector<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
                       .
                       super__Vector_base<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            while (ppTVar13 = ppTVar13 + 1, ppTVar13 != ppTVar1) {
              left = TIntermediate::growAggregate
                               ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                                (TIntermNode *)left,&(*ppTVar13)->super_TIntermNode);
              *arguments = (TIntermTyped *)left;
            }
          }
          else {
            iVar4 = (*(pTVar6->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                      _vptr_TIntermNode[0x32])(pTVar6);
            iVar5 = (*(pTVar6->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                      _vptr_TIntermNode[0x32])(pTVar6);
            __position = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::erase
                                   ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>
                                     *)CONCAT44(extraout_var_06,iVar4),
                                    (TIntermNode **)
                                    ((long)(iVar3 + iVar10) * 8 +
                                    *(long *)(CONCAT44(extraout_var_07,iVar5) + 8)));
            iVar4 = (*(pTVar6->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                      _vptr_TIntermNode[0x32])(pTVar6);
            std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::
            insert<__gnu_cxx::__normal_iterator<glslang::TIntermTyped*const*,std::vector<glslang::TIntermTyped*,glslang::pool_allocator<glslang::TIntermTyped*>>>,void>
                      ((vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)
                       CONCAT44(extraout_var_08,iVar4),(const_iterator)__position._M_current,
                       (__normal_iterator<glslang::TIntermTyped_*const_*,_std::vector<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>_>
                        )memberArgs.
                         super_vector<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
                         .
                         super__Vector_base<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                       (__normal_iterator<glslang::TIntermTyped_*const_*,_std::vector<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>_>
                        )memberArgs.
                         super_vector<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
                         .
                         super__Vector_base<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
          }
          iVar3 = iVar3 + (int)((ulong)((long)memberArgs.
                                              super_vector<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
                                              .
                                              super__Vector_base<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)memberArgs.
                                             super_vector<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
                                             .
                                             super__Vector_base<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
        }
      }
    }
    uVar11 = (ulong)(iVar10 + 1);
  }
  if (pTVar6 != (TIntermAggregate *)0x0) {
    addStructBuffArguments(this,loc,&aggregate);
  }
  return;
}

Assistant:

void HlslParseContext::expandArguments(const TSourceLoc& loc, const TFunction& function, TIntermTyped*& arguments)
{
    TIntermAggregate* aggregate = arguments->getAsAggregate();
    int functionParamNumberOffset = 0;

    // Replace a single argument with a single argument.
    const auto setArg = [&](int paramNum, TIntermTyped* arg) {
        if (function.getParamCount() + functionParamNumberOffset == 1)
            arguments = arg;
        else {
            if (aggregate == nullptr)
                arguments = arg;
            else
                aggregate->getSequence()[paramNum] = arg;
        }
    };

    // Replace a single argument with a list of arguments
    const auto setArgList = [&](int paramNum, const TVector<TIntermTyped*>& args) {
        if (args.size() == 1)
            setArg(paramNum, args.front());
        else if (args.size() > 1) {
            if (function.getParamCount() + functionParamNumberOffset == 1) {
                arguments = intermediate.makeAggregate(args.front());
                std::for_each(args.begin() + 1, args.end(),
                    [&](TIntermTyped* arg) {
                        arguments = intermediate.growAggregate(arguments, arg);
                    });
            } else {
                auto it = aggregate->getSequence().erase(aggregate->getSequence().begin() + paramNum);
                aggregate->getSequence().insert(it, args.begin(), args.end());
            }
            functionParamNumberOffset += (int)(args.size() - 1);
        }
    };

    // Process each argument's conversion
    for (int param = 0; param < function.getParamCount(); ++param) {
        // At this early point there is a slight ambiguity between whether an aggregate 'arguments'
        // is the single argument itself or its children are the arguments.  Only one argument
        // means take 'arguments' itself as the one argument.
        TIntermTyped* arg = function.getParamCount() == 1
                                   ? arguments->getAsTyped()
                                   : (aggregate ?
                                        aggregate->getSequence()[param + functionParamNumberOffset]->getAsTyped() :
                                        arguments->getAsTyped());

        if (wasFlattened(arg) && shouldFlatten(*function[param].type, function[param].type->getQualifier().storage, true)) {
            // Need to pass the structure members instead of the structure.
            TVector<TIntermTyped*> memberArgs;
            for (int memb = 0; memb < (int)arg->getType().getStruct()->size(); ++memb)
                memberArgs.push_back(flattenAccess(arg, memb));
            setArgList(param + functionParamNumberOffset, memberArgs);
        }
    }

    // TODO: if we need both hidden counter args (below) and struct expansion (above)
    // the two algorithms need to be merged: Each assumes the list starts out 1:1 between
    // parameters and arguments.

    // If any argument is a pass-by-reference struct buffer with an associated counter
    // buffer, we have to add another hidden parameter for that counter.
    if (aggregate)
        addStructBuffArguments(loc, aggregate);
}